

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::DecorationManager::AreDecorationsTheSame
          (DecorationManager *this,Instruction *inst1,Instruction *inst2,bool ignore_target)

{
  Op OVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Operand *o1;
  Operand *o2;
  bool bVar5;
  
  OVar1 = inst1->opcode_;
  if ((((OVar1 - OpDecorate < 2) || (OVar1 == OpDecorateString)) || (OVar1 == OpDecorateId)) &&
     (OVar1 == inst2->opcode_)) {
    uVar3 = Instruction::NumInOperands(inst1);
    uVar4 = Instruction::NumInOperands(inst2);
    if (uVar3 == uVar4) {
      uVar3 = (uint32_t)ignore_target;
      do {
        uVar4 = Instruction::NumInOperands(inst1);
        bVar5 = uVar4 <= uVar3;
        if (bVar5) {
          return bVar5;
        }
        o1 = Instruction::GetInOperand(inst1,uVar3);
        o2 = Instruction::GetInOperand(inst2,uVar3);
        bVar2 = opt::operator!=(o1,o2);
        uVar3 = uVar3 + 1;
      } while (!bVar2);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool DecorationManager::AreDecorationsTheSame(const Instruction* inst1,
                                              const Instruction* inst2,
                                              bool ignore_target) const {
  switch (inst1->opcode()) {
    case spv::Op::OpDecorate:
    case spv::Op::OpMemberDecorate:
    case spv::Op::OpDecorateId:
    case spv::Op::OpDecorateStringGOOGLE:
      break;
    default:
      return false;
  }

  if (inst1->opcode() != inst2->opcode() ||
      inst1->NumInOperands() != inst2->NumInOperands())
    return false;

  for (uint32_t i = ignore_target ? 1u : 0u; i < inst1->NumInOperands(); ++i)
    if (inst1->GetInOperand(i) != inst2->GetInOperand(i)) return false;

  return true;
}